

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPListener.cpp
# Opt level: O0

void __thiscall hwnet::TCPListener::OnActive(TCPListener *this,int event)

{
  Poller *this_00;
  uint uVar1;
  uint uVar2;
  enable_shared_from_this<hwnet::TCPListener> local_38;
  shared_ptr<hwnet::Task> local_28;
  byte local_15;
  uint local_14;
  bool post;
  TCPListener *pTStack_10;
  int event_local;
  TCPListener *this_local;
  
  local_15 = 0;
  local_14 = event;
  pTStack_10 = this;
  std::mutex::lock(&this->mtx);
  uVar1 = local_14;
  uVar2 = Poller::ReadFlag();
  if ((uVar1 & uVar2) != 0) {
    this->readableVer = this->readableVer + 1;
  }
  if ((this->doing & 1U) == 0) {
    this->doing = true;
    local_15 = 1;
  }
  std::mutex::unlock(&this->mtx);
  if ((local_15 & 1) != 0) {
    this_00 = this->poller_;
    std::enable_shared_from_this<hwnet::TCPListener>::shared_from_this(&local_38);
    std::shared_ptr<hwnet::Task>::shared_ptr<hwnet::TCPListener,void>
              (&local_28,(shared_ptr<hwnet::TCPListener> *)&local_38);
    Poller::PostTask(this_00,&local_28,(ThreadPool *)0x0);
    std::shared_ptr<hwnet::Task>::~shared_ptr(&local_28);
    std::shared_ptr<hwnet::TCPListener>::~shared_ptr((shared_ptr<hwnet::TCPListener> *)&local_38);
  }
  return;
}

Assistant:

void TCPListener::OnActive(int event) {
	auto post = false;

	this->mtx.lock();
	
	if(event & Poller::ReadFlag()) {
		++this->readableVer;
	}

	if(!doing) {
		this->doing = true;
		post = true;
	}
	
	this->mtx.unlock();
	
	if(post) {
		poller_->PostTask(shared_from_this());
	}
}